

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3d6ae::TestTestRunnerFixtureReporterNotifiedOfTestCount::RunImpl
          (TestTestRunnerFixtureReporterNotifiedOfTestCount *this)

{
  TestDetails *details;
  TestRunnerFixtureReporterNotifiedOfTestCountHelper fixtureHelper;
  
  details = &(this->super_Test).m_details;
  TestRunnerFixture::TestRunnerFixture(&fixtureHelper.super_TestRunnerFixture);
  fixtureHelper.m_details = details;
  UnitTest::ExecuteTest<(anonymous_namespace)::TestRunnerFixtureReporterNotifiedOfTestCountHelper>
            (&fixtureHelper,details);
  TestRunnerFixture::~TestRunnerFixture(&fixtureHelper.super_TestRunnerFixture);
  return;
}

Assistant:

TEST_FIXTURE(TestRunnerFixture, ReporterNotifiedOfTestCount)
{
    MockTest test1("test", true, false);
    MockTest test2("test", true, false);
    MockTest test3("test", true, false);
    list.Add(&test1);
    list.Add(&test2);
    list.Add(&test3);

	runner.RunTestsIf(list, NULL, True(), 0);
    CHECK_EQUAL(3, reporter.summaryTotalTestCount);
}